

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O2

int Gia_ManSimSimulate(Gia_Man_t *pAig,Gia_ParSim_t *pPars)

{
  int iVar1;
  uint uVar2;
  abctime aVar3;
  abctime aVar4;
  Gia_ManSim_t *p;
  ulong uVar5;
  Abc_Cex_t *pAVar6;
  ulong uVar7;
  uint *puVar8;
  abctime time;
  int i;
  uint uVar9;
  ulong uVar10;
  char *p_00;
  Gia_ManSim_t *pGVar11;
  Gia_Man_t *pGVar12;
  uint iFrame;
  long lVar13;
  int local_58;
  long local_48;
  
  aVar3 = Abc_Clock();
  iVar1 = pPars->TimeLimit;
  if ((long)iVar1 == 0) {
    local_48 = 0;
  }
  else {
    aVar4 = Abc_Clock();
    local_48 = aVar4 + (long)iVar1 * 1000000;
  }
  if ((pAig->pReprs != (Gia_Rpr_t *)0x0) && (pAig->pNexts != (int *)0x0)) {
    iVar1 = Gia_ManSimSimulateEquiv(pAig,pPars);
    return iVar1;
  }
  if (pAig->pCexSeq != (Abc_Cex_t *)0x0) {
    free(pAig->pCexSeq);
    pAig->pCexSeq = (Abc_Cex_t *)0x0;
  }
  p_00 = (char *)pPars;
  p = Gia_ManSimCreate(pAig,pPars);
  Gia_ManResetRandom(pPars);
  Gia_ManSimInfoInit(p);
  local_58 = 0;
  iFrame = 0;
  do {
    if (pPars->nIters <= (int)iFrame) {
LAB_002016bc:
      Gia_ManSimDelete(p);
      if (pAig->pCexSeq == (Abc_Cex_t *)0x0) {
        p_00 = "No bug detected after simulating %d frames with %d words.  ";
        Abc_Print((int)p,"No bug detected after simulating %d frames with %d words.  ",(ulong)iFrame
                  ,(ulong)(uint)pPars->nWords);
      }
      aVar4 = Abc_Clock();
      Abc_PrintTime((int)aVar4 - (int)aVar3,p_00,time);
      return local_58;
    }
    pGVar11 = p;
    Gia_ManSimulateRound(p);
    iVar1 = (int)pGVar11;
    if (pPars->fVerbose != 0) {
      Abc_Print(iVar1,"Frame %4d out of %4d and timeout %3d sec. ",(ulong)(iFrame + 1),
                (ulong)(uint)pPars->nIters,(ulong)(uint)pPars->TimeLimit);
      aVar4 = Abc_Clock();
      p_00 = "Time = %7.2f sec\r";
      Abc_Print(iVar1,"Time = %7.2f sec\r",((double)aVar4 - (double)aVar3) / 1000000.0);
    }
    if (pPars->fCheckMiter != 0) {
      uVar2 = p->pAig->vCos->nSize - p->pAig->nRegs;
      uVar10 = 0;
      uVar5 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar5 = uVar10;
      }
LAB_002015ba:
      iVar1 = (int)uVar10;
      if (iVar1 != (int)uVar5) {
        uVar2 = p->nWords;
        uVar7 = 0;
        if (0 < (int)uVar2) {
          uVar7 = (ulong)uVar2;
        }
        puVar8 = p->pDataSimCos + (int)(uVar2 * iVar1);
        for (lVar13 = 0; p_00 = (char *)(uVar7 * 0x20 + lVar13),
            (Gia_ParSim_t *)p_00 != (Gia_ParSim_t *)0x0; lVar13 = lVar13 + -0x20) {
          uVar2 = *puVar8;
          p_00 = (char *)(ulong)uVar2;
          if (uVar2 != 0) {
            uVar9 = 0;
            goto LAB_002015fd;
          }
          puVar8 = puVar8 + 1;
        }
        goto LAB_00201613;
      }
    }
    aVar4 = Abc_Clock();
    if (local_48 < aVar4) {
      iFrame = iFrame + 1;
      goto LAB_002016bc;
    }
    if ((int)iFrame < pPars->nIters + -1) {
      Gia_ManSimInfoTransfer(p);
    }
    iFrame = iFrame + 1;
  } while( true );
LAB_002015fd:
  if (uVar9 == 0x20) goto LAB_0020160b;
  if ((uVar2 >> (uVar9 & 0x1f) & 1) != 0) goto LAB_0020160e;
  uVar9 = uVar9 + 1;
  goto LAB_002015fd;
LAB_0020160b:
  uVar9 = 0xffffffff;
LAB_0020160e:
  if (-1 < (int)(uVar9 - (int)lVar13)) {
    Gia_ManResetRandom(pPars);
    pPars->iOutFail = iVar1;
    pGVar12 = pAig;
    pAVar6 = Gia_ManGenerateCounter(pAig,iFrame,iVar1,p->nWords,uVar9 - (int)lVar13,p->vCis2Ids);
    pAig->pCexSeq = pAVar6;
    Abc_Print((int)pGVar12,"Output %d of miter \"%s\" was asserted in frame %d.  ",uVar10,
              pAig->pName,(ulong)iFrame);
    p_00 = (char *)pAig->pCexSeq;
    pGVar12 = pAig;
    iVar1 = Gia_ManVerifyCex(pAig,(Abc_Cex_t *)p_00,0);
    local_58 = 1;
    if (iVar1 == 0) {
      p_00 = "\nGenerated counter-example is INVALID.                    ";
      Abc_Print((int)pGVar12,"\nGenerated counter-example is INVALID.                    ");
    }
    goto LAB_002016bc;
  }
LAB_00201613:
  uVar10 = (ulong)(iVar1 + 1);
  goto LAB_002015ba;
}

Assistant:

int Gia_ManSimSimulate( Gia_Man_t * pAig, Gia_ParSim_t * pPars )
{
    extern int Gia_ManSimSimulateEquiv( Gia_Man_t * pAig, Gia_ParSim_t * pPars );
    Gia_ManSim_t * p;
    abctime clkTotal = Abc_Clock();
    int i, iOut, iPat, RetValue = 0;
    abctime nTimeToStop = pPars->TimeLimit ? pPars->TimeLimit * CLOCKS_PER_SEC + Abc_Clock(): 0;
    if ( pAig->pReprs && pAig->pNexts )
        return Gia_ManSimSimulateEquiv( pAig, pPars );
    ABC_FREE( pAig->pCexSeq );
    p = Gia_ManSimCreate( pAig, pPars );
    Gia_ManResetRandom( pPars );
    Gia_ManSimInfoInit( p );
    for ( i = 0; i < pPars->nIters; i++ )
    {
        Gia_ManSimulateRound( p );
        if ( pPars->fVerbose )
        {
            Abc_Print( 1, "Frame %4d out of %4d and timeout %3d sec. ", i+1, pPars->nIters, pPars->TimeLimit );
            Abc_Print( 1, "Time = %7.2f sec\r", (1.0*Abc_Clock()-clkTotal)/CLOCKS_PER_SEC );
        }
        if ( pPars->fCheckMiter && Gia_ManCheckPos( p, &iOut, &iPat ) )
        {
            Gia_ManResetRandom( pPars );
            pPars->iOutFail = iOut;
            pAig->pCexSeq = Gia_ManGenerateCounter( pAig, i, iOut, p->nWords, iPat, p->vCis2Ids );
            Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", iOut, pAig->pName, i );
            if ( !Gia_ManVerifyCex( pAig, pAig->pCexSeq, 0 ) )
            {
//                Abc_Print( 1, "\n" );
                Abc_Print( 1, "\nGenerated counter-example is INVALID.                    " );
//                Abc_Print( 1, "\n" );
            }
            else
            {
//                Abc_Print( 1, "\n" );
//                if ( pPars->fVerbose )
//                Abc_Print( 1, "\nGenerated counter-example is verified correctly.         " );
//                Abc_Print( 1, "\n" );
            }
            RetValue = 1;
            break;
        }
        if ( Abc_Clock() > nTimeToStop )
        {
            i++;
            break;
        }
        if ( i < pPars->nIters - 1 )
            Gia_ManSimInfoTransfer( p );
    }
    Gia_ManSimDelete( p );
    if ( pAig->pCexSeq == NULL )
        Abc_Print( 1, "No bug detected after simulating %d frames with %d words.  ", i, pPars->nWords );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
    return RetValue;
}